

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zmq.cpp
# Opt level: O3

int zmq_poller_destroy(void **poller_p_)

{
  socket_poller_t *this;
  bool bVar1;
  int *piVar2;
  
  if (((poller_p_ != (void **)0x0) &&
      (this = (socket_poller_t *)*poller_p_, this != (socket_poller_t *)0x0)) &&
     (bVar1 = zmq::socket_poller_t::check_tag(this), bVar1)) {
    zmq::socket_poller_t::~socket_poller_t(this);
    operator_delete(this,0x38);
    *poller_p_ = (void *)0x0;
    return 0;
  }
  piVar2 = __errno_location();
  *piVar2 = 0xe;
  return -1;
}

Assistant:

int zmq_poller_destroy (void **poller_p_)
{
    if (poller_p_) {
        const zmq::socket_poller_t *const poller =
          static_cast<const zmq::socket_poller_t *> (*poller_p_);
        if (poller && poller->check_tag ()) {
            delete poller;
            *poller_p_ = NULL;
            return 0;
        }
    }
    errno = EFAULT;
    return -1;
}